

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::EnsureConsumeBranchIsland(IRBuilder *this)

{
  ByteCodeReader *this_00;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint uVar4;
  LayoutSize byteOffset;
  LayoutSize LVar5;
  undefined4 *puVar6;
  OpLayoutBr *pOVar7;
  LayoutSize local_40;
  LayoutSize local_3c;
  LayoutSize layoutSize;
  LayoutSize layoutSize_1;
  uint targetOffset;
  uint offset;
  
  this_00 = &this->m_jnReader;
  OVar3 = Js::ByteCodeReader::PeekOp(this_00,&local_40);
  if (OVar3 == Br) {
    layoutSize_1 = Js::ByteCodeReader::GetCurrentOffset(this_00);
    OVar3 = Js::ByteCodeReader::ReadOp(this_00,&local_3c);
    if (OVar3 != Br) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c13,"(opcode == Js::OpCode::Br)","opcode == Js::OpCode::Br");
      if (!bVar2) goto LAB_004dc911;
      *puVar6 = 0;
    }
    if (local_3c != SmallLayout) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c14,"(layoutSize == Js::SmallLayout)","layoutSize == Js::SmallLayout");
      if (!bVar2) goto LAB_004dc911;
      *puVar6 = 0;
    }
    pOVar7 = Js::ByteCodeReader::Br(this_00);
    uVar4 = Js::ByteCodeReader::GetCurrentOffset(this_00);
    layoutSize = (int)pOVar7->RelativeJumpOffset + uVar4;
    byteOffset = Js::ByteCodeReader::GetCurrentOffset(this_00);
    if (byteOffset != layoutSize) {
      OVar3 = Js::ByteCodeReader::PeekOp(this_00,&local_40);
      if (OVar3 == BrLong) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          OVar3 = Js::ByteCodeReader::ReadOp(this_00,&local_3c);
          if (OVar3 != BrLong) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1c24,"(opcode == Js::OpCode::BrLong)",
                               "opcode == Js::OpCode::BrLong");
            if (!bVar2) goto LAB_004dc911;
            *puVar6 = 0;
          }
          if (local_3c != SmallLayout) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1c25,"(layoutSize == Js::SmallLayout)",
                               "layoutSize == Js::SmallLayout");
            if (!bVar2) goto LAB_004dc911;
            *puVar6 = 0;
          }
          Js::ByteCodeReader::BrLong(this_00);
          OVar3 = Js::ByteCodeReader::PeekOp(this_00,&local_40);
        } while (OVar3 == BrLong);
      }
      LVar5 = Js::ByteCodeReader::GetCurrentOffset(this_00);
      if (LVar5 == layoutSize) {
        Js::ByteCodeReader::SetCurrentOffset(this_00,byteOffset);
        ConsumeBranchIsland(this);
        if (this->longBranchMap == (LongBranchMap *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c33,"(longBranchMap)","longBranchMap");
          if (!bVar2) goto LAB_004dc911;
          *puVar6 = 0;
        }
        if (this->m_offsetToInstructionCount <= layoutSize_1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c34,"(offset < m_offsetToInstructionCount)",
                             "offset < m_offsetToInstructionCount");
          if (!bVar2) goto LAB_004dc911;
          *puVar6 = 0;
        }
        if (this->m_offsetToInstruction[layoutSize_1] != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c35,"(m_offsetToInstruction[offset] == nullptr)",
                             "m_offsetToInstruction[offset] == nullptr");
          if (!bVar2) {
LAB_004dc911:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        this->m_offsetToInstruction[layoutSize_1] = (Instr *)&DAT_ffffffffffffffff;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->longBranchMap,&layoutSize_1,&layoutSize);
        return;
      }
    }
    Js::ByteCodeReader::SetCurrentOffset(this_00,layoutSize_1);
  }
  return;
}

Assistant:

void
IRBuilder::EnsureConsumeBranchIsland()
{
    if (m_jnReader.PeekOp() == Js::OpCode::Br)
    {
        // Save the old offset
        uint offset = m_jnReader.GetCurrentOffset();

        // Read the potentially a branch around
        Js::LayoutSize layoutSize;
        Js::OpCode opcode = m_jnReader.ReadOp(layoutSize);
        Assert(opcode == Js::OpCode::Br);
        Assert(layoutSize == Js::SmallLayout);
        const unaligned Js::OpLayoutBr * playout = m_jnReader.Br();
        unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + playout->RelativeJumpOffset;

        uint branchIslandOffset = m_jnReader.GetCurrentOffset();
        if (branchIslandOffset == targetOffset)
        {
            // branch to next, there is no long branch
            m_jnReader.SetCurrentOffset(offset);
            return;
        }

        // Ignore all the BrLong
        while (m_jnReader.PeekOp() == Js::OpCode::BrLong)
        {
            opcode = m_jnReader.ReadOp(layoutSize);
            Assert(opcode == Js::OpCode::BrLong);
            Assert(layoutSize == Js::SmallLayout);
            m_jnReader.BrLong();
        }

        // Confirm that is a branch around
        if ((uint)m_jnReader.GetCurrentOffset() == targetOffset)
        {
            // Really consume the branch island
            m_jnReader.SetCurrentOffset(branchIslandOffset);
            ConsumeBranchIsland();

            // Mark the virtual branch around as a redirect long branch as well
            // so that if it is the target of another branch, it will just keep pass
            // the branch island
            Assert(longBranchMap);
            Assert(offset < m_offsetToInstructionCount);
            Assert(m_offsetToInstruction[offset] == nullptr);
            m_offsetToInstruction[offset] = VirtualLongBranchInstr;
            longBranchMap->Add(offset, targetOffset);
        }
        else
        {
            // Reset the offset
            m_jnReader.SetCurrentOffset(offset);
        }
    }
}